

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O3

void __thiscall
QTextOdfWriter::writeInlineCharacter
          (QTextOdfWriter *this,QXmlStreamWriter *writer,QTextFragment *fragment)

{
  char16_t *pcVar1;
  ulong uVar2;
  undefined8 uVar3;
  Data *pDVar4;
  char *pcVar5;
  QPoint QVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  QMetaType QVar10;
  QByteArray *pQVar11;
  QPoint QVar12;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar13;
  QImage *image;
  QArrayData *pQVar14;
  QTextFormat *this_00;
  size_t in_R9;
  QVariant *__return_storage_ptr__;
  long in_FS_OFFSET;
  QByteArrayView QVar15;
  QAnyStringView QVar16;
  QByteArrayView QVar17;
  QAnyStringView QVar18;
  QLatin1String QVar19;
  QByteArrayView QVar20;
  QAnyStringView QVar21;
  QByteArrayView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  QByteArrayView QVar25;
  QAnyStringView QVar26;
  QByteArrayView QVar27;
  QAnyStringView QVar28;
  QAnyStringView QVar29;
  QAnyStringView QVar30;
  QAnyStringView QVar31;
  QAnyStringView QVar32;
  QAnyStringView QVar33;
  QAnyStringView QVar34;
  QAnyStringView QVar35;
  QAnyStringView QVar36;
  QAnyStringView QVar37;
  QAnyStringView QVar38;
  QAnyStringView QVar39;
  QAnyStringView QVar40;
  QImageWriter imageWriter;
  QUrl url;
  qreal height;
  qreal width;
  QString local_170;
  char16_t *local_158;
  ulong uStack_150;
  undefined1 local_148 [16];
  QPoint local_138;
  QUrl local_130;
  QString local_128;
  undefined1 local_108 [16];
  QPoint local_f8;
  qreal local_e8;
  double local_e0;
  QString local_d8;
  QByteArray local_b8;
  QColorSpace local_98;
  ulong uStack_90;
  undefined1 local_88 [16];
  QPoint local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  QExplicitlySharedDataPointer<QColorSpacePrivate> local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (this->drawNS).d.ptr;
  uVar2 = (this->drawNS).d.size;
  QVar15.m_data = &DAT_00000005;
  QVar15.m_size = (qsizetype)(local_68 + 0x10);
  QString::fromLatin1(QVar15);
  QVar16.m_size = (size_t)pcVar1;
  QVar16.field_0.m_data_utf8 = (char *)writer;
  QVar29.m_size = local_58._8_8_;
  QVar29.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar16,QVar29);
  if ((totally_ordered_wrapper<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
       )local_58._0_8_ !=
      (totally_ordered_wrapper<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_58._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  if (this->m_strategy != (QOutputStrategy *)0x0) {
    QTextFragment::charFormat((QTextFragment *)(local_68 + 0x10));
    iVar9 = QTextFormat::type((QTextFormat *)(local_68 + 0x10));
    if (iVar9 == 2) {
      iVar9 = QTextFormat::intProperty((QTextFormat *)(local_68 + 0x10),0x2f00);
      QTextFormat::~QTextFormat((QTextFormat *)(local_68 + 0x10));
      if (iVar9 != 1) goto LAB_005b6f6f;
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFragment::charFormat((QTextFragment *)(local_68 + 0x10));
      QTextFormat::toImageFormat((QTextFormat *)local_68);
      QTextFormat::~QTextFormat((QTextFormat *)(local_68 + 0x10));
      pcVar1 = (this->drawNS).d.ptr;
      uVar2 = (this->drawNS).d.size;
      QVar17.m_data = (storage_type *)0x4;
      QVar17.m_size = (qsizetype)(local_68 + 0x10);
      QString::fromLatin1(QVar17);
      QTextFormat::stringProperty((QString *)local_88,(QTextFormat *)local_68,0x5000);
      local_98.d_ptr.d.ptr =
           (QExplicitlySharedDataPointer<QColorSpacePrivate>)
           (QExplicitlySharedDataPointer<QColorSpacePrivate>)local_88._8_8_;
      uStack_90 = (ulong)local_78 | 0x8000000000000000;
      QVar18.m_size = (size_t)pcVar1;
      QVar18.field_0.m_data_utf8 = (char *)writer;
      QVar30.m_size = local_58._8_8_;
      QVar30.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
      QVar36.m_size = in_R9;
      QVar36.field_0.m_data = (void *)((ulong)local_48.d.ptr | 0x8000000000000000);
      QXmlStreamWriter::writeAttribute(QVar18,QVar30,QVar36);
      if ((QMetaTypeInterface *)local_88._0_8_ != (QMetaTypeInterface *)0x0) {
        LOCK();
        *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_88._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if ((totally_ordered_wrapper<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
           )local_58._0_8_ !=
          (totally_ordered_wrapper<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
           )0x0) {
        LOCK();
        *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_58._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
        }
      }
      local_b8.d.size._0_4_ = 0;
      local_b8.d.size._4_4_ = 0;
      local_b8.d.d = (Data *)0x0;
      local_b8.d.ptr = (char *)0x0;
      local_d8.d.size._0_4_ = 0;
      local_d8.d.size._4_4_ = 0;
      local_d8.d.d = (Data *)0x0;
      local_d8.d.ptr = (char16_t *)0x0;
      local_e0 = 0.0;
      local_e8 = 0.0;
      local_f8 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage((QImage *)local_108);
      local_128.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QTextFormat::stringProperty(&local_128,(QTextFormat *)local_68,0x5000);
      QVar19.m_data = (char *)0x2;
      QVar19.m_size = (qsizetype)&local_128;
      cVar7 = QString::startsWith(QVar19,0x6af88e);
      if (cVar7 != '\0') {
        QString::insert((longlong)&local_128,(QLatin1String)(ZEXT816(3) << 0x40));
      }
      QVar12 = (QPoint)&local_130;
      local_130.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QUrl::QUrl((QUrl *)QVar12,(QString *)&local_128,TolerantMode);
      __return_storage_ptr__ = (QVariant *)(local_68 + 0x10);
      local_48.d.ptr = (totally_ordered_wrapper<QColorSpacePrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextDocument::resource(__return_storage_ptr__,this->m_document,2,(QUrl *)QVar12);
      iVar9 = ::QVariant::typeId(__return_storage_ptr__);
      if ((iVar9 == 0x1001) ||
         (iVar9 = ::QVariant::typeId((QVariant *)(local_68 + 0x10)), iVar9 == 0x1006)) {
        local_88._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QImage>::metaType;
        local_148._0_8_ = (ulong)puStack_40 & 0xfffffffffffffffc;
        bVar8 = comparesEqual((QMetaType *)local_148,(QMetaType *)local_88);
        if (bVar8) {
          if (((ulong)puStack_40 & 1) == 0) {
            image = (QImage *)(local_68 + 0x10);
          }
          else {
            image = (QImage *)
                    (local_58._0_8_ +
                    (long)(int)(((ArrayOptions *)(local_58._0_8_ + 4))->
                               super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                               super_QFlagsStorage<QArrayData::ArrayOption>.i);
          }
          QImage::QImage((QImage *)local_148,image);
        }
        else {
          local_138 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
          local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_148._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QImage::QImage((QImage *)local_148);
          QVar10.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
          if (((ulong)puStack_40 & 1) != 0) {
            __return_storage_ptr__ =
                 (QVariant *)
                 (local_58._0_8_ +
                 (long)(int)(((ArrayOptions *)(local_58._0_8_ + 4))->
                            super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                            super_QFlagsStorage<QArrayData::ArrayOption>.i);
          }
          QMetaType::convert(QVar10,__return_storage_ptr__,(QMetaType)local_88._0_8_,local_148);
        }
        local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QPaintDevice::QPaintDevice((QPaintDevice *)local_88);
        QVar12 = local_f8;
        local_f8 = local_138;
        local_88._0_8_ = &PTR__QImage_007d1ec8;
        local_138.xp.m_i = 0;
        local_138.yp.m_i = 0;
        local_78 = QVar12;
        QImage::~QImage((QImage *)local_88);
        QImage::~QImage((QImage *)local_148);
      }
      else {
        iVar9 = ::QVariant::typeId((QVariant *)(local_68 + 0x10));
        if (iVar9 == 0xc) {
          ::QVariant::toByteArray();
          QVar12 = local_78;
          uVar3 = local_88._0_8_;
          pcVar5 = local_b8.d.ptr;
          pDVar4 = local_b8.d.d;
          local_88._0_8_ = local_b8.d.d;
          local_b8.d.d = (Data *)uVar3;
          local_b8.d.ptr = (char *)local_88._8_8_;
          local_88._8_8_ = pcVar5;
          local_78.xp.m_i = (undefined4)local_b8.d.size;
          local_78.yp.m_i = local_b8.d.size._4_4_;
          QVar6 = local_78;
          local_78.xp = QVar12.xp.m_i;
          local_78.yp = QVar12.yp.m_i;
          local_b8.d.size._0_4_ = local_78.xp.m_i;
          local_b8.d.size._4_4_ = local_78.yp.m_i;
          local_78 = QVar6;
          if ((QMetaTypeInterface *)pDVar4 != (QMetaTypeInterface *)0x0) {
            LOCK();
            *(int *)pDVar4 = *(int *)pDVar4 + -1;
            UNLOCK();
            if (*(int *)pDVar4 == 0) {
              QArrayData::deallocate(&pDVar4->super_QArrayData,1,0x10);
            }
          }
          local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QBuffer::QBuffer((QBuffer *)local_88,&local_b8,(QObject *)0x0);
          QBuffer::open((QBuffer *)local_88,1);
          QVar12 = (QPoint)&local_e0;
          probeImageData((QIODevice *)local_88,(QImage *)local_108,&local_d8,(qreal *)QVar12,
                         &local_e8);
          QBuffer::~QBuffer((QBuffer *)local_88);
        }
        else {
          local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_148._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QTextFormat::stringProperty((QString *)local_88,(QTextFormat *)local_68,0x5000);
          QFile::QFile((QFile *)local_148,(QString *)local_88);
          if ((QMetaTypeInterface *)local_88._0_8_ != (QMetaTypeInterface *)0x0) {
            LOCK();
            *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_88._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          cVar7 = QFile::open(local_148);
          if (cVar7 != '\0') {
            QVar12 = (QPoint)&local_e0;
            bVar8 = probeImageData((QIODevice *)local_148,(QImage *)local_108,&local_d8,
                                   (qreal *)QVar12,&local_e8);
            if (!bVar8) {
              QFileDevice::seek((longlong)local_148);
              QIODevice::readAll();
              QVar12 = local_78;
              uVar3 = local_88._0_8_;
              pcVar5 = local_b8.d.ptr;
              pDVar4 = local_b8.d.d;
              local_88._0_8_ = local_b8.d.d;
              local_b8.d.d = (Data *)uVar3;
              local_b8.d.ptr = (char *)local_88._8_8_;
              local_88._8_8_ = pcVar5;
              local_78.xp.m_i = (undefined4)local_b8.d.size;
              local_78.yp.m_i = local_b8.d.size._4_4_;
              QVar6 = local_78;
              local_78.xp = QVar12.xp.m_i;
              local_78.yp = QVar12.yp.m_i;
              local_b8.d.size._0_4_ = local_78.xp.m_i;
              local_b8.d.size._4_4_ = local_78.yp.m_i;
              local_78 = QVar6;
              if ((QMetaTypeInterface *)pDVar4 != (QMetaTypeInterface *)0x0) {
                LOCK();
                *(int *)pDVar4 = *(int *)pDVar4 + -1;
                UNLOCK();
                if (*(int *)pDVar4 == 0) {
                  QArrayData::deallocate(&pDVar4->super_QArrayData,1,0x10);
                }
              }
            }
          }
          QFile::~QFile((QFile *)local_148);
        }
      }
      bVar8 = QImage::isNull((QImage *)local_108);
      if (!bVar8) {
        local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_148._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QBuffer::QBuffer((QBuffer *)local_148,(QObject *)0x0);
        iVar9 = QTextFormat::intProperty((QTextFormat *)local_68,0x5014);
        if ((iVar9 - 100U < 0xffffff9d) ||
           (bVar8 = QImage::hasAlphaChannel((QImage *)local_108), bVar8)) {
          local_170.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray((QByteArray *)local_88,"png",-1);
          QImageWriter::QImageWriter
                    ((QImageWriter *)&local_170,(QIODevice *)local_148,(QByteArray *)local_88);
          __buf = extraout_RDX;
          if ((QMetaTypeInterface *)local_88._0_8_ != (QMetaTypeInterface *)0x0) {
            LOCK();
            *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_88._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
              __buf = extraout_RDX_00;
            }
          }
          QImageWriter::write((QImageWriter *)&local_170,(int)local_108,__buf,(size_t)QVar12);
          pQVar11 = (QByteArray *)QBuffer::data();
          QByteArray::operator=(&local_b8,pQVar11);
          local_d8.d.ptr = L"image/png";
          pQVar14 = &(local_d8.d.d)->super_QArrayData;
        }
        else {
          local_170.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray((QByteArray *)local_88,"jpg",-1);
          QImageWriter::QImageWriter
                    ((QImageWriter *)&local_170,(QIODevice *)local_148,(QByteArray *)local_88);
          if ((QMetaTypeInterface *)local_88._0_8_ != (QMetaTypeInterface *)0x0) {
            LOCK();
            *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_88._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
            }
          }
          QImageWriter::setQuality((QImageWriter *)&local_170,iVar9);
          QImageWriter::write((QImageWriter *)&local_170,(int)local_108,__buf_00,(size_t)QVar12);
          pQVar11 = (QByteArray *)QBuffer::data();
          QByteArray::operator=(&local_b8,pQVar11);
          local_d8.d.ptr = L"image/jpg";
          pQVar14 = &(local_d8.d.d)->super_QArrayData;
        }
        local_d8.d.d = (Data *)0x0;
        local_d8.d.size._0_4_ = 9;
        local_d8.d.size._4_4_ = 0;
        if (pQVar14 != (QArrayData *)0x0) {
          LOCK();
          (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar14,2,0x10);
          }
        }
        QImageWriter::~QImageWriter((QImageWriter *)&local_170);
        iVar9 = QImage::width((QImage *)local_108);
        local_e0 = (double)iVar9;
        iVar9 = QImage::height((QImage *)local_108);
        local_e8 = (qreal)iVar9;
        QBuffer::~QBuffer((QBuffer *)local_148);
      }
      if ((QPoint)local_b8.d.size != (QPoint)0x0) {
        bVar8 = QTextFormat::hasProperty((QTextFormat *)local_68,0x5010);
        if (bVar8) {
          local_e0 = QTextFormat::doubleProperty((QTextFormat *)local_68,0x5010);
        }
        bVar8 = QTextFormat::hasProperty((QTextFormat *)local_68,0x5011);
        if (bVar8) {
          local_e8 = QTextFormat::doubleProperty((QTextFormat *)local_68,0x5011);
        }
        local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QOutputStrategy::createUniqueImageName((QString *)local_88,this->m_strategy);
        (*this->m_strategy->_vptr_QOutputStrategy[2])
                  (this->m_strategy,(QString *)local_88,&local_d8,&local_b8);
        pcVar1 = (this->svgNS).d.ptr;
        uVar2 = (this->svgNS).d.size;
        QVar20.m_data = &DAT_00000005;
        QVar20.m_size = (qsizetype)local_148;
        QString::fromLatin1(QVar20);
        uVar3 = local_148._8_8_;
        aVar13.m_data = (void *)((ulong)local_138 | 0x8000000000000000);
        pixelToPoint(&local_170,local_e0);
        local_158 = local_170.d.ptr;
        uStack_150 = local_170.d.size | 0x8000000000000000;
        QVar21.m_size = (size_t)pcVar1;
        QVar21.field_0.m_data_utf8 = (char *)writer;
        QVar31.m_size = uVar3;
        QVar31.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
        QVar37.m_size = in_R9;
        QVar37.field_0.m_data = aVar13.m_data;
        QXmlStreamWriter::writeAttribute(QVar21,QVar31,QVar37);
        if (&(local_170.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_170.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QMetaTypeInterface *)local_148._0_8_ != (QMetaTypeInterface *)0x0) {
          LOCK();
          *(int *)local_148._0_8_ = *(int *)local_148._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_148._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
          }
        }
        pcVar1 = (this->svgNS).d.ptr;
        uVar2 = (this->svgNS).d.size;
        QVar22.m_data = &DAT_00000006;
        QVar22.m_size = (qsizetype)local_148;
        QString::fromLatin1(QVar22);
        uVar3 = local_148._8_8_;
        aVar13.m_data = (void *)((ulong)local_138 | 0x8000000000000000);
        pixelToPoint(&local_170,local_e8);
        QVar23.m_size = (size_t)pcVar1;
        QVar23.field_0.m_data_utf8 = (char *)writer;
        QVar32.m_size = uVar3;
        QVar32.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
        QVar38.m_size = in_R9;
        QVar38.field_0.m_data = aVar13.m_data;
        QXmlStreamWriter::writeAttribute(QVar23,QVar32,QVar38);
        if (&(local_170.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_170.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QMetaTypeInterface *)local_148._0_8_ != (QMetaTypeInterface *)0x0) {
          LOCK();
          *(int *)local_148._0_8_ = *(int *)local_148._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_148._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
          }
        }
        QVar33.field_0.m_data = (void *)((this->textNS).d.size | 0x8000000000000000);
        QVar24.m_size = (size_t)(this->textNS).d.ptr;
        QVar24.field_0.m_data_utf8 = (char *)writer;
        QVar33.m_size = (size_t)L"anchor-type";
        QVar39.m_size = in_R9;
        QVar39.field_0.m_data = (void *)0x800000000000000b;
        QXmlStreamWriter::writeAttribute(QVar24,QVar33,QVar39);
        pcVar1 = (this->drawNS).d.ptr;
        uVar2 = (this->drawNS).d.size;
        QVar25.m_data = &DAT_00000005;
        QVar25.m_size = (qsizetype)local_148;
        QString::fromLatin1(QVar25);
        QVar26.m_size = (size_t)pcVar1;
        QVar26.field_0.m_data_utf8 = (char *)writer;
        QVar34.m_size = local_148._8_8_;
        QVar34.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
        QXmlStreamWriter::writeStartElement(QVar26,QVar34);
        if ((QMetaTypeInterface *)local_148._0_8_ != (QMetaTypeInterface *)0x0) {
          LOCK();
          *(int *)local_148._0_8_ = *(int *)local_148._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_148._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
          }
        }
        pcVar1 = (this->xlinkNS).d.ptr;
        uVar2 = (this->xlinkNS).d.size;
        QVar27.m_data = (storage_type *)0x4;
        QVar27.m_size = (qsizetype)local_148;
        QString::fromLatin1(QVar27);
        QVar40.field_0.m_data = (void *)((ulong)local_138 | 0x8000000000000000);
        QVar28.m_size = (size_t)pcVar1;
        QVar28.field_0.m_data_utf8 = (char *)writer;
        QVar35.m_size = local_148._8_8_;
        QVar35.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
        QVar40.m_size = in_R9;
        QXmlStreamWriter::writeAttribute(QVar28,QVar35,QVar40);
        if ((QMetaTypeInterface *)local_148._0_8_ != (QMetaTypeInterface *)0x0) {
          LOCK();
          *(int *)local_148._0_8_ = *(int *)local_148._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_148._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
          }
        }
        QXmlStreamWriter::writeEndElement();
        if ((QMetaTypeInterface *)local_88._0_8_ != (QMetaTypeInterface *)0x0) {
          LOCK();
          *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_88._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
      }
      ::QVariant::~QVariant((QVariant *)(local_68 + 0x10));
      QUrl::~QUrl(&local_130);
      if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
        }
      }
      QImage::~QImage((QImage *)local_108);
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QMetaTypeInterface *)local_b8.d.d != (QMetaTypeInterface *)0x0) {
        LOCK();
        *(int *)local_b8.d.d = *(int *)local_b8.d.d + -1;
        UNLOCK();
        if (*(int *)local_b8.d.d == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
        }
      }
      this_00 = (QTextFormat *)local_68;
    }
    else {
      this_00 = (QTextFormat *)(local_68 + 0x10);
    }
    QTextFormat::~QTextFormat(this_00);
  }
LAB_005b6f6f:
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextOdfWriter::writeInlineCharacter(QXmlStreamWriter &writer, const QTextFragment &fragment) const
{
    writer.writeStartElement(drawNS, QString::fromLatin1("frame"));
    if (m_strategy == nullptr) {
        // don't do anything.
    }
    else if (fragment.charFormat().isImageFormat()) {
        QTextImageFormat imageFormat = fragment.charFormat().toImageFormat();
        writer.writeAttribute(drawNS, QString::fromLatin1("name"), imageFormat.name());

        QByteArray data;
        QString mimeType;
        qreal width = 0;
        qreal height = 0;

        QImage image;
        QString name = imageFormat.name();
        if (name.startsWith(":/"_L1)) // auto-detect resources
            name.prepend("qrc"_L1);
        QUrl url = QUrl(name);
        const QVariant variant = m_document->resource(QTextDocument::ImageResource, url);
        if (variant.userType() == QMetaType::QPixmap || variant.userType() == QMetaType::QImage) {
            image = qvariant_cast<QImage>(variant);
        } else if (variant.userType() == QMetaType::QByteArray) {
            data = variant.toByteArray();

            QBuffer buffer(&data);
            buffer.open(QIODevice::ReadOnly);
            probeImageData(&buffer, &image, &mimeType, &width, &height);
        } else {
            // try direct loading
            QFile file(imageFormat.name());
            if (file.open(QIODevice::ReadOnly) && !probeImageData(&file, &image, &mimeType, &width, &height)) {
                file.seek(0);
                data = file.readAll();
            }
        }

        if (! image.isNull()) {
            QBuffer imageBytes;

            int imgQuality = imageFormat.quality();
            if (imgQuality >= 100 || imgQuality <= 0 || image.hasAlphaChannel()) {
                QImageWriter imageWriter(&imageBytes, "png");
                imageWriter.write(image);

                data = imageBytes.data();
                mimeType = QStringLiteral("image/png");
            } else {
                // Write images without alpha channel as jpg with quality set by QTextImageFormat
                QImageWriter imageWriter(&imageBytes, "jpg");
                imageWriter.setQuality(imgQuality);
                imageWriter.write(image);

                data = imageBytes.data();
                mimeType = QStringLiteral("image/jpg");
            }

            width = image.width();
            height = image.height();
        }

        if (!data.isEmpty()) {
            if (imageFormat.hasProperty(QTextFormat::ImageWidth)) {
                width = imageFormat.width();
            }
            if (imageFormat.hasProperty(QTextFormat::ImageHeight)) {
                height = imageFormat.height();
            }

            QString filename = m_strategy->createUniqueImageName();

            m_strategy->addFile(filename, mimeType, data);

            writer.writeAttribute(svgNS, QString::fromLatin1("width"), pixelToPoint(width));
            writer.writeAttribute(svgNS, QString::fromLatin1("height"), pixelToPoint(height));
            writer.writeAttribute(textNS, QStringLiteral("anchor-type"), QStringLiteral("as-char"));
            writer.writeStartElement(drawNS, QString::fromLatin1("image"));
            writer.writeAttribute(xlinkNS, QString::fromLatin1("href"), filename);
            writer.writeEndElement(); // image
        }
    }
    writer.writeEndElement(); // frame
}